

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int orbit_prune(saucy *s)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  lVar2 = (long)s->start[s->lev];
  lVar3 = (long)(s->right).clen[lVar2];
  if (0 < lVar3) {
    piVar1 = (s->right).lab;
    iVar4 = -1;
    lVar5 = 0;
    do {
      if ((piVar1[lVar2 + lVar3] < piVar1[lVar2 + lVar5]) &&
         ((iVar4 == -1 || (piVar1[lVar2 + lVar5] <= piVar1[lVar2 + iVar4])))) {
        iVar4 = (int)lVar5;
      }
      lVar5 = lVar5 + 1;
    } while (lVar3 != lVar5);
    return iVar4;
  }
  return -1;
}

Assistant:

static int
orbit_prune(struct saucy *s)
{
    int i, label, fixed, min = -1;
    int k = s->start[s->lev];
    int size = s->right.clen[k] + 1;
    int *cell = s->right.lab + k;

    /* The previously fixed value */
    fixed = cell[size-1];

    /* Look for the next minimum cell representative */
    for (i = 0; i < size-1; ++i) {
        label = cell[i];

        /* Skip things we've already considered */
        if (label <= fixed) continue;

        /* Skip things that we'll consider later */
        if (min != -1 && label > cell[min]) continue;

        /* New candidate minimum */
        min = i;
    }

    return min;
}